

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall
Logger::StructuredFileOutputSink::StructuredFileOutputSink
          (StructuredFileOutputSink *this,uint logMask,FastString *fileName,bool appendToFile,
          int breakSize)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  long lVar3;
  char *__modes;
  undefined4 local_50 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  
  (this->super_OutputSink).logMask = logMask;
  (this->super_OutputSink)._vptr_OutputSink = (_func_int **)&PTR_checkFlags_00125c40;
  pthread_mutex_init((pthread_mutex_t *)&this->lock,(pthread_mutexattr_t *)0x0);
  Bstrlib::String::String(&this->baseFileName,fileName);
  this->breakSize = breakSize;
  this->currentSize = 0;
  this->flipFlop = false;
  this->lastMessageCount = 0;
  Bstrlib::String::String(&this->lastMessage);
  this->lastTime = 0;
  this->lastFlags = 0;
  __modes = "wb";
  if (appendToFile) {
    __modes = "ab";
  }
  __stream = fopen((char *)(fileName->super_tagbstring).data,__modes);
  this->file = (FILE *)__stream;
  if (__stream != (FILE *)0x0) {
    local_48 = 0;
    uStack_40 = 0;
    local_50[0] = 1;
    iVar1 = fileno(__stream);
    fcntl(iVar1,6,local_50);
    iVar1 = fileno((FILE *)this->file);
    uVar2 = fcntl(iVar1,1);
    iVar1 = fileno((FILE *)this->file);
    fcntl(iVar1,2,(ulong)(uVar2 | 1));
    iVar1 = fileno((FILE *)this->file);
    fcntl(iVar1,1);
    fseek((FILE *)this->file,0,2);
    lVar3 = ftell((FILE *)this->file);
    this->currentSize = (int)lVar3;
    if (breakSize < (int)lVar3) {
      iVar1 = fileno((FILE *)this->file);
      ftruncate(iVar1,0);
      this->currentSize = 0;
    }
    return;
  }
  fprintf(_stderr,"Logger can not open file \'%s\'\n",(fileName->super_tagbstring).data);
  return;
}

Assistant:

StructuredFileOutputSink::StructuredFileOutputSink(unsigned int logMask, const Strings::FastString & fileName, const bool appendToFile, const int breakSize)
        : OutputSink(logMask), baseFileName(fileName), breakSize(breakSize), currentSize(0), flipFlop(false), lastMessageCount(0), lastTime(0), lastFlags(0),
#ifdef _WIN32
        file(_fsopen(fileName, appendToFile ? "ab" : "wb", _SH_DENYWR))
#elif defined(_POSIX)
        file(fopen(fileName, appendToFile ? "ab" : "wb"))
#endif
	{
        if (file)
        {
#if defined(_POSIX)
            struct flock fl;
            fl.l_whence = SEEK_SET;
            fl.l_start = 0;
            fl.l_len = 0;
            fl.l_type = F_WRLCK;
            fcntl(fileno(file), F_SETLK, &fl);

            // Prevent any child process from inheriting the file on forking
            int flags = fcntl(fileno(file), F_GETFD);
            flags |= FD_CLOEXEC;
            fcntl(fileno(file), F_SETFD, flags);
            flags = fcntl(fileno(file), F_GETFD);
#endif
            // Find out the file size (and leave the pointer at end of file)
            fseek(file, 0, SEEK_END);
            currentSize = (int)ftell(file);
            if (currentSize > breakSize)
            {
                // Truncate the file
#ifdef _WIN32
                _chsize_s(_fileno(file), 0);
                currentSize = 0;
#elif defined(_POSIX)
                ftruncate(fileno(file), 0);
                currentSize = 0;
#endif
            }
        } else fprintf(stderr, "Logger can not open file '%s'\n", (const char*)fileName);
    }